

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O0

void __thiscall t_json_generator::generate_service(t_json_generator *this,t_service *tservice)

{
  bool bVar1;
  t_service *ptVar2;
  string *psVar3;
  size_type sVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar5;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_1d8;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_1d0;
  iterator fn_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_1a8;
  string local_188;
  string local_168;
  reference local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *annotation;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  string local_120;
  string local_100;
  allocator local_d9;
  string local_d8;
  string local_b8;
  allocator local_91;
  string local_90;
  string local_70;
  allocator local_39;
  string local_38;
  t_service *local_18;
  t_service *tservice_local;
  t_json_generator *this_local;
  
  local_18 = tservice;
  tservice_local = (t_service *)this;
  start_object(this,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"name",&local_39);
  get_qualified_name_abi_cxx11_(&local_70,this,&local_18->super_t_type);
  write_key_and_string(this,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  ptVar2 = t_service::get_extends(local_18);
  if (ptVar2 != (t_service *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"extends",&local_91);
    ptVar2 = t_service::get_extends(local_18);
    get_qualified_name_abi_cxx11_(&local_b8,this,&ptVar2->super_t_type);
    write_key_and_string(this,&local_90,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  bVar1 = t_doc::has_doc((t_doc *)local_18);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"doc",&local_d9);
    psVar3 = t_doc::get_doc_abi_cxx11_((t_doc *)local_18);
    std::__cxx11::string::string((string *)&local_100,(string *)psVar3);
    write_key_and_string(this,&local_d8,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(&(local_18->super_t_type).annotations_);
  if (sVar4 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_120,"annotations",(allocator *)((long)&__range2 + 7));
    write_key_and(this,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    start_object(this,true);
    this_00 = &(local_18->super_t_type).annotations_;
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(this_00);
    annotation = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end(this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&annotation), bVar1) {
      local_148 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*(&__end2);
      std::__cxx11::string::string((string *)&local_168,(string *)local_148);
      std::__cxx11::string::string((string *)&local_188,(string *)&local_148->second);
      write_key_and_string(this,&local_168,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_168);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
    end_object(this);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1a8,"functions",
             (allocator *)
             ((long)&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  write_key_and(this,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  start_array(this);
  __x = t_service::get_functions(local_18);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter,__x);
  local_1d0._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
  while( true ) {
    local_1d8._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
    bVar1 = __gnu_cxx::operator!=(&local_1d0,&local_1d8);
    if (!bVar1) break;
    write_comma_if_needed(this);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1d0);
    generate_function(this,*pptVar5);
    indicate_comma_needed(this);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_1d0,0);
  }
  end_array(this);
  end_object(this);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
  return;
}

Assistant:

void t_json_generator::generate_service(t_service* tservice) {
  start_object();

  write_key_and_string("name", get_qualified_name(tservice));

  if (tservice->get_extends()) {
    write_key_and_string("extends", get_qualified_name(tservice->get_extends()));
  }

  if (tservice->has_doc()) {
    write_key_and_string("doc", tservice->get_doc());
  }

  if (tservice->annotations_.size() > 0) {
    write_key_and("annotations");
    start_object();
    for (auto & annotation : tservice->annotations_) {
      write_key_and_string(annotation.first, annotation.second);
    }
    end_object();
  }

  write_key_and("functions");
  start_array();
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator fn_iter = functions.begin();
  for (; fn_iter != functions.end(); fn_iter++) {
    write_comma_if_needed();
    generate_function(*fn_iter);
    indicate_comma_needed();
  }
  end_array();

  end_object();
}